

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseEditDelete(linenoiseState *l)

{
  linenoiseState *l_local;
  
  if ((l->len != 0) && (l->pos < l->len)) {
    memmove(l->buf + l->pos,l->buf + l->pos + 1,(l->len - l->pos) - 1);
    l->len = l->len - 1;
    l->buf[l->len] = '\0';
    refreshLine(l);
  }
  return;
}

Assistant:

static void linenoiseEditDelete(struct linenoiseState *l) {
    if (l->len > 0 && l->pos < l->len) {
        memmove(l->buf+l->pos,l->buf+l->pos+1,l->len-l->pos-1);
        l->len--;
        l->buf[l->len] = '\0';
        refreshLine(l);
    }
}